

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeI8x16Const
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,array<unsigned_char,_16UL> *vals)

{
  Result<wasm::Ok> *pRVar1;
  size_t i;
  long lVar2;
  Literal *this_00;
  undefined1 local_218 [8];
  array<wasm::Literal,_16UL> lanes;
  anon_union_16_6_1532cd5a_for_Literal_0 local_70;
  undefined8 local_60;
  Literal local_58;
  Result<wasm::Ok> *local_40;
  Index local_34;
  
  this_00 = (Literal *)local_218;
  local_40 = __return_storage_ptr__;
  local_34 = pos;
  memset(this_00,0,0x180);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    local_70.i32 = (int32_t)vals->_M_elems[lVar2];
    local_60 = 2;
    Literal::operator=(this_00,(Literal *)&local_70.func);
    Literal::~Literal((Literal *)&local_70.func);
    this_00 = this_00 + 1;
  }
  Literal::Literal(&local_58,(LaneArray<16> *)local_218);
  IRBuilder::makeConst((Result<wasm::Ok> *)&lanes._M_elems[0xf].type,&this->irBuilder,&local_58);
  pRVar1 = local_40;
  withLoc<wasm::Ok>(local_40,this,local_34,(Result<wasm::Ok> *)&lanes._M_elems[0xf].type);
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)&lanes._M_elems[0xf].type);
  Literal::~Literal(&local_58);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_218);
  return pRVar1;
}

Assistant:

Result<> makeI8x16Const(Index pos,
                          const std::vector<Annotation>& annotations,
                          const std::array<uint8_t, 16>& vals) {
    std::array<Literal, 16> lanes;
    for (size_t i = 0; i < 16; ++i) {
      lanes[i] = Literal(uint32_t(vals[i]));
    }
    return withLoc(pos, irBuilder.makeConst(Literal(lanes)));
  }